

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbglintegrationplugin.h
# Opt level: O0

void __thiscall QXcbGlIntegrationPlugin::~QXcbGlIntegrationPlugin(QXcbGlIntegrationPlugin *this)

{
  code *pcVar1;
  QXcbGlIntegrationPlugin *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

class Q_XCB_EXPORT QXcbGlIntegrationPlugin : public QObject
{
    Q_OBJECT
public:
        explicit QXcbGlIntegrationPlugin(QObject *parent = nullptr)
            : QObject(parent)
        { }

        virtual QXcbGlIntegration *create() = 0;
    // the pattern expected by qLoadPlugin calls for a QString argument.
    // we don't need it, so don't bother subclasses with it:
    QXcbGlIntegration *create(const QString &) { return create(); }
}